

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

bool Catch::TestCaseTracking::operator==(NameAndLocation *lhs,NameAndLocation *rhs)

{
  __type_conflict _Var1;
  bool local_21;
  NameAndLocation *rhs_local;
  NameAndLocation *lhs_local;
  
  if ((lhs->location).line == (rhs->location).line) {
    _Var1 = std::operator==(&lhs->name,&rhs->name);
    local_21 = false;
    if (_Var1) {
      local_21 = SourceLineInfo::operator==(&lhs->location,&rhs->location);
    }
    lhs_local._7_1_ = local_21;
  }
  else {
    lhs_local._7_1_ = false;
  }
  return lhs_local._7_1_;
}

Assistant:

bool operator==(NameAndLocation const& lhs, NameAndLocation const& rhs) {
            // This is a very cheap check that should have a very high hit rate.
            // If we get to SourceLineInfo::operator==, we will redo it, but the
            // cost of repeating is trivial at that point (we will be paying
            // multiple strcmp/memcmps at that point).
            if ( lhs.location.line != rhs.location.line ) { return false; }
            return lhs.name == rhs.name && lhs.location == rhs.location;
        }